

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::unaligned_dense_assignment_loop<false>::
     run<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,16,Eigen::Stride<0,0>>>,Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,_1,1,false>const>>,Eigen::internal::assign_op<double,double>,0>>
               (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_16,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                *kernel,Index start,Index end)

{
  DstEvaluatorType *pDVar1;
  SrcEvaluatorType *pSVar2;
  
  pDVar1 = kernel->m_dst;
  pSVar2 = kernel->m_src;
  for (; start < end; start = start + 1) {
    (pDVar1->
    super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_16,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
    ).m_data[start] =
         (pSVar2->
         super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
         ).m_d.lhsImpl.
         super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
         .m_functor.m_other *
         (pSVar2->
         super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
         ).m_d.rhsImpl.
         super_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>
         .
         super_block_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_true>
         .
         super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
         .m_data[start];
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC static EIGEN_STRONG_INLINE void run(Kernel &kernel,
                                      Index start,
                                      Index end)
#endif
  {
    for (Index index = start; index < end; ++index)
      kernel.assignCoeff(index);
  }